

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldLiteGenerator::GenerateBuilderMembers
          (ImmutableEnumOneofFieldLiteGenerator *this,Printer *printer)

{
  bool bVar1;
  LogMessage *other;
  FileDescriptor *descriptor;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  Printer *local_18;
  Printer *printer_local;
  ImmutableEnumOneofFieldLiteGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  bVar1 = HasHazzer((this->super_ImmutableEnumFieldLiteGenerator).descriptor_);
  local_51 = 0;
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_enum_field_lite.cc"
               ,0x1b0);
    local_51 = 1;
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: HasHazzer(descriptor_): ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  WriteFieldAccessorDocComment
            (local_18,(this->super_ImmutableEnumFieldLiteGenerator).descriptor_,HAZZER,false);
  io::Printer::Print(local_18,&(this->super_ImmutableEnumFieldLiteGenerator).variables_,
                     "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return instance.has$capitalized_name$();\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (local_18,"{","}",(this->super_ImmutableEnumFieldLiteGenerator).descriptor_);
  descriptor = FieldDescriptor::file((this->super_ImmutableEnumFieldLiteGenerator).descriptor_);
  bVar1 = SupportUnknownEnumValue(descriptor);
  if (bVar1) {
    WriteFieldEnumValueAccessorDocComment
              (local_18,(this->super_ImmutableEnumFieldLiteGenerator).descriptor_,GETTER,false);
    io::Printer::Print(local_18,&(this->super_ImmutableEnumFieldLiteGenerator).variables_,
                       "@java.lang.Override\n$deprecation$public int ${$get$capitalized_name$Value$}$() {\n  return instance.get$capitalized_name$Value();\n}\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (local_18,"{","}",(this->super_ImmutableEnumFieldLiteGenerator).descriptor_);
    WriteFieldEnumValueAccessorDocComment
              (local_18,(this->super_ImmutableEnumFieldLiteGenerator).descriptor_,SETTER,true);
    io::Printer::Print(local_18,&(this->super_ImmutableEnumFieldLiteGenerator).variables_,
                       "$deprecation$public Builder ${$set$capitalized_name$Value$}$(int value) {\n  copyOnWrite();\n  instance.set$capitalized_name$Value(value);\n  return this;\n}\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (local_18,"{","}",(this->super_ImmutableEnumFieldLiteGenerator).descriptor_);
  }
  WriteFieldAccessorDocComment
            (local_18,(this->super_ImmutableEnumFieldLiteGenerator).descriptor_,GETTER,false);
  io::Printer::Print(local_18,&(this->super_ImmutableEnumFieldLiteGenerator).variables_,
                     "@java.lang.Override\n$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n  return instance.get$capitalized_name$();\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (local_18,"{","}",(this->super_ImmutableEnumFieldLiteGenerator).descriptor_);
  WriteFieldAccessorDocComment
            (local_18,(this->super_ImmutableEnumFieldLiteGenerator).descriptor_,SETTER,true);
  io::Printer::Print(local_18,&(this->super_ImmutableEnumFieldLiteGenerator).variables_,
                     "$deprecation$public Builder ${$set$capitalized_name$$}$($type$ value) {\n  copyOnWrite();\n  instance.set$capitalized_name$(value);\n  return this;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (local_18,"{","}",(this->super_ImmutableEnumFieldLiteGenerator).descriptor_);
  WriteFieldAccessorDocComment
            (local_18,(this->super_ImmutableEnumFieldLiteGenerator).descriptor_,CLEARER,true);
  io::Printer::Print(local_18,&(this->super_ImmutableEnumFieldLiteGenerator).variables_,
                     "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n  copyOnWrite();\n  instance.clear$capitalized_name$();\n  return this;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (local_18,"{","}",(this->super_ImmutableEnumFieldLiteGenerator).descriptor_);
  return;
}

Assistant:

void ImmutableEnumOneofFieldLiteGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  GOOGLE_DCHECK(HasHazzer(descriptor_));
  WriteFieldAccessorDocComment(printer, descriptor_, HAZZER);
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
                 "  return instance.has$capitalized_name$();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, GETTER);
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$public int ${$get$capitalized_name$Value$}$() {\n"
        "  return instance.get$capitalized_name$Value();\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, SETTER,
                                          /* builder */ true);
    printer->Print(variables_,
                   "$deprecation$public Builder "
                   "${$set$capitalized_name$Value$}$(int value) {\n"
                   "  copyOnWrite();\n"
                   "  instance.set$capitalized_name$Value(value);\n"
                   "  return this;\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
  }
  WriteFieldAccessorDocComment(printer, descriptor_, GETTER);
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n"
                 "  return instance.get$capitalized_name$();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, SETTER,
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder "
                 "${$set$capitalized_name$$}$($type$ value) {\n"
                 "  copyOnWrite();\n"
                 "  instance.set$capitalized_name$(value);\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  copyOnWrite();\n"
      "  instance.clear$capitalized_name$();\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
}